

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<capnp::Orphan<capnp::json::Value::Field>_> * __thiscall
kj::ArrayBuilder<capnp::Orphan<capnp::json::Value::Field>_>::operator=
          (ArrayBuilder<capnp::Orphan<capnp::json::Value::Field>_> *this,
          ArrayBuilder<capnp::Orphan<capnp::json::Value::Field>_> *other)

{
  RemoveConst<capnp::Orphan<capnp::json::Value::Field>_> *pRVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  pRVar1 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar1;
  pAVar2 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar2;
  other->ptr = (Orphan<capnp::json::Value::Field> *)0x0;
  other->pos = (RemoveConst<capnp::Orphan<capnp::json::Value::Field>_> *)0x0;
  other->endPtr = (Orphan<capnp::json::Value::Field> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }